

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

int nifti_read_collapsed_image(nifti_image *nim,int *dims,void **data)

{
  char *data_00;
  int iVar1;
  int iVar2;
  void *pvVar3;
  znzFile file;
  size_t base_offset;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  znzFile fp;
  int prods [8];
  int pivots [8];
  
  if (((nim == (nifti_image *)0x0) || (dims == (int *)0x0)) || (data == (void **)0x0)) {
    fprintf(_stderr,"** nifti_RCI: bad params %p, %p, %p\n",nim,dims,data);
    return -1;
  }
  if (2 < g_opts_0) {
    nifti_read_collapsed_image_cold_1();
  }
  iVar1 = nifti_nim_is_valid(nim,(uint)(0 < g_opts_0));
  if (iVar1 == 0) {
    nifti_read_collapsed_image_cold_3();
    return -1;
  }
  uVar7 = nim->dim[0];
  uVar5 = (ulong)uVar7;
  if (0 < (int)uVar7) {
    uVar4 = 0;
    do {
      if (nim->dim[uVar4 + 1] <= dims[uVar4 + 1]) {
        fprintf(_stderr,"** nifti_RCI: dims[%d] >= nim->dim[%d] (%d,%d)\n",(ulong)((int)uVar4 + 1));
        return -1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  uVar4 = 0;
  if (0 < (int)uVar7) {
    do {
      prods[uVar4] = 1;
      iVar2 = (int)uVar5;
      iVar1 = 1;
      if (iVar2 < 1) {
        iVar1 = iVar2;
      }
      iVar1 = iVar1 + -1;
      iVar2 = iVar2 + 1;
      do {
        if ((nim->dim[uVar5] != 1) && (dims[uVar5] != -1)) {
          iVar1 = (int)uVar5;
          break;
        }
        prods[uVar4] = nim->dim[uVar5] * prods[uVar4];
        uVar5 = uVar5 - 1;
        iVar2 = iVar2 + -1;
      } while (1 < iVar2);
      pivots[uVar4] = iVar1;
      uVar4 = uVar4 + 1;
      uVar5 = (ulong)(iVar1 - 1);
    } while (1 < iVar1);
  }
  uVar7 = (uint)uVar4;
  uVar4 = uVar4 & 0xffffffff;
  if (prods[uVar4 + 7] != 0) {
    pivots[uVar4] = 0;
    prods[uVar4] = 1;
    uVar7 = uVar7 + 1;
  }
  if (2 < g_opts_0) {
    nifti_read_collapsed_image_cold_2();
  }
  uVar6 = nim->nbyper;
  if ((uVar7 - 9 < 0xfffffff8) || ((int)uVar6 < 0)) {
    fprintf(_stderr,"** rci_am: bad params, %d, %d\n",(ulong)uVar6,(ulong)uVar7);
  }
  else {
    if ((int)uVar7 < 1) {
      iVar1 = 1;
    }
    else {
      iVar1 = 1;
      uVar5 = 0;
      do {
        iVar1 = iVar1 * prods[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar7 != uVar5);
    }
    uVar6 = iVar1 * uVar6;
    if (*data != (void *)0x0) {
      if (1 < g_opts_0) {
        fprintf(_stderr,"-d rci_am: *data already set, need %d (%d x %d) bytes\n",(ulong)uVar6);
      }
      goto LAB_0011519a;
    }
    if (1 < g_opts_0) {
      fprintf(_stderr,"+d alloc %d (= %d x %d) bytes for collapsed image\n",(ulong)uVar6);
    }
    pvVar3 = malloc((long)(int)uVar6);
    *data = pvVar3;
    if (pvVar3 != (void *)0x0) goto LAB_0011519a;
    fprintf(_stderr,"** rci_am: failed to alloc %d bytes for data\n",(ulong)uVar6);
  }
  uVar6 = 0xffffffff;
LAB_0011519a:
  if ((int)uVar6 < 0) {
    return -1;
  }
  file = nifti_image_load_prep(nim);
  data_00 = (char *)*data;
  fp = file;
  if (file == (znzFile)0x0) {
    free(data_00);
    *data = (void *)0x0;
  }
  else {
    base_offset = znztell(file);
    iVar1 = rci_read_data(nim,pivots,prods,uVar7,dims,data_00,file,base_offset);
    Xznzclose(&fp);
    if (-1 < iVar1) {
      if (1 < g_opts_0) {
        fprintf(_stderr,"+d read %d bytes of collapsed image from %s\n",(ulong)uVar6,nim->fname);
        return uVar6;
      }
      return uVar6;
    }
    free(*data);
    *data = (void *)0x0;
  }
  return -1;
}

Assistant:

int nifti_read_collapsed_image( nifti_image * nim, const int dims [8],
                                void ** data )
{
   znzFile fp;
   int     pivots[8], prods[8], nprods; /* sizes are bounded by dims[], so 8 */
   int     c, bytes;

   /** - check pointers for sanity */
   if( !nim || !dims || !data ){
      fprintf(stderr,"** nifti_RCI: bad params %p, %p, %p\n",
              (void *)nim, (const void *)dims, (void *)data);
      return -1;
   }

   if( g_opts.debug > 2 ){
      fprintf(stderr,"-d read_collapsed_image:\n        dims =");
      for(c = 0; c < 8; c++) fprintf(stderr," %3d", dims[c]);
      fprintf(stderr,"\n   nim->dims =");
      for(c = 0; c < 8; c++) fprintf(stderr," %3d", nim->dim[c]);
      fputc('\n', stderr);
   }

   /** - verify that dim[] makes sense */
   if( ! nifti_nim_is_valid(nim, g_opts.debug > 0) ){
      fprintf(stderr,"** invalid nim (file is '%s')\n", nim->fname );
      return -1;
   }

   /** - verify that dims[] makes sense for this dataset */
   for( c = 1; c <= nim->dim[0]; c++ ){
      if( dims[c] >= nim->dim[c] ){
         fprintf(stderr,"** nifti_RCI: dims[%d] >= nim->dim[%d] (%d,%d)\n",
                 c, c, dims[c], nim->dim[c]);
         return -1;
      }
   }

   /** - prepare pivot list - pivots are fixed indices */
   if( make_pivot_list(nim, dims, pivots, prods, &nprods) < 0 ) return -1;

   bytes = rci_alloc_mem(data, prods, nprods, nim->nbyper);
   if( bytes < 0 ) return -1;

   /** - open the image file for reading at the appropriate offset */
   fp = nifti_image_load_prep( nim );
   if( ! fp ){ free(*data);  *data = NULL;  return -1; }     /* failure */

   /** - call the recursive reading function, passing nim, the pivot info,
         location to store memory, and file pointer and position */
   c = rci_read_data(nim, pivots,prods,nprods,dims,
                     (char *)*data, fp, znztell(fp));
   znzclose(fp);   /* in any case, close the file */
   if( c < 0 ){ free(*data);  *data = NULL;  return -1; }    /* failure */

   if( g_opts.debug > 1 )
      fprintf(stderr,"+d read %d bytes of collapsed image from %s\n",
              bytes, nim->fname);

   return bytes;
}